

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uoffset_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::ReferTo(FlatBufferBuilderImpl<false> *this,uoffset_t off)

{
  uint uVar1;
  
  Align(this,4);
  uVar1 = ReferTo<unsigned_int>(this,off,(this->buf_).size_);
  return uVar1;
}

Assistant:

uoffset_t ReferTo(uoffset_t off) {
    // Align to ensure GetSizeRelative32BitRegion() below is correct.
    Align(sizeof(uoffset_t));
    // 32-bit offsets are relative to the tail of the 32-bit region of the
    // buffer. For most cases (without 64-bit entities) this is equivalent to
    // size of the whole buffer (e.g. GetSize())
    return ReferTo(off, GetSizeRelative32BitRegion());
  }